

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void initSystem(int begX,int begY)

{
  int iVar1;
  char cVar2;
  WINDOW *pWVar3;
  undefined8 uVar4;
  arrow *paVar5;
  pointer pnVar6;
  int iVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  long lVar9;
  pointer pnVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  allocator local_119;
  ulong local_118;
  long local_110;
  int local_104;
  int local_100;
  int local_fc;
  long local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  node local_d8;
  
  local_118 = CONCAT44(in_register_00000034,begY);
  local_110 = 0;
  startX = begX;
  startY = begY;
  for (iVar7 = 0; uVar8 = local_118, iVar11 = startX, iVar1 = (int)local_118, iVar7 < grid_size[0];
      iVar7 = iVar7 + 1) {
    local_fc = iVar1 + 1;
    local_100 = iVar1 + 3;
    local_104 = iVar1 + 0xb;
    local_f0 = (long)(int)local_110;
    lVar9 = local_f0 * 0xa8;
    uVar12 = startX + 0x1c;
    lVar14 = 0;
    while( true ) {
      if (grid_size[1] <= (int)lVar14) break;
      local_f8 = local_110 + lVar14;
      node::node(&local_d8,(uint8_t)local_f8);
      std::vector<node,_std::allocator<node>_>::emplace_back<node>(&grid,&local_d8);
      local_e8 = lVar14;
      local_e0 = (ulong)uVar12;
      node::~node(&local_d8);
      iVar11 = (int)local_118;
      pWVar3 = new_bwin(0xb,0x1a,iVar11,uVar12 - 0x1b);
      iVar1 = local_fc;
      *(WINDOW **)
       ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
              _M_start)->arrows + lVar9 + -0x80) = pWVar3;
      uVar4 = newwin(9,4,local_fc,uVar12 - 6);
      *(undefined8 *)
       ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
              _M_start)->arrows + lVar9 + -0x70) = uVar4;
      uVar4 = newwin(9,0x12,iVar1,uVar12 - 0x1a);
      *(undefined8 *)
       ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
              _M_start)->arrows + lVar9 + -0x78) = uVar4;
      pWVar3 = new_bwin(0xb,0x14,iVar11,uVar12 - 0x1b);
      pnVar6 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *(WINDOW **)
       ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
              _M_start)->arrows + lVar9 + -0x60) = pWVar3;
      wprintw(*(undefined8 *)((long)pnVar6->arrows + lVar9 + -0x70)," ACC%d\n BAK%d",
              (int)*(short *)((long)pnVar6->arrows + lVar9 + -0x56),
              (int)*(short *)((long)pnVar6->arrows + lVar9 + -0x54));
      wrefresh(*(undefined8 *)
                ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                        super__Vector_impl_data._M_start)->arrows + lVar9 + -0x70));
      refresh();
      lVar14 = local_e8;
      iVar1 = grid_size[1];
      if (iVar7 != 0) {
        *(undefined8 *)
         ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                 super__Vector_impl_data._M_start)->arrows + lVar9) =
             *(undefined8 *)
              ((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start[-(long)grid_size[1]].arrows + lVar9 + 0x10);
      }
      iVar13 = (int)local_e8;
      iVar11 = (int)local_e0;
      cVar2 = (char)local_e8;
      if (iVar13 != iVar1 + -1) {
        paVar5 = (arrow *)operator_new(0x20);
        arrow::arrow(paVar5,(int8_t)local_f8,(char)local_110 + cVar2 + '\x01',local_100,iVar11,false
                    );
        *(arrow **)
         ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                 super__Vector_impl_data._M_start)->arrows + lVar9 + 8) = paVar5;
        std::vector<arrowType_*,_std::allocator<arrowType_*>_>::push_back
                  (&gridArrows,
                   (value_type *)
                   ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                           super__Vector_impl_data._M_start)->arrows + lVar9 + 8));
      }
      iVar1 = grid_size[0];
      if (iVar7 != grid_size[0] + -1) {
        paVar5 = (arrow *)operator_new(0x20);
        arrow::arrow(paVar5,(int8_t)local_f8,(char)iVar1 + (char)local_110 + cVar2,local_104,
                     iVar11 + -0x14,true);
        *(arrow **)
         ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                 super__Vector_impl_data._M_start)->arrows + lVar9 + 0x10) = paVar5;
        std::vector<arrowType_*,_std::allocator<arrowType_*>_>::push_back
                  (&gridArrows,
                   (value_type *)
                   ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                           super__Vector_impl_data._M_start)->arrows + lVar9 + 0x10));
      }
      if (iVar13 != 0) {
        *(undefined8 *)
         ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                 super__Vector_impl_data._M_start)->arrows + lVar9 + 0x18) =
             *(undefined8 *)
              ((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9 + -0x18);
      }
      lVar14 = lVar14 + 1;
      lVar9 = lVar9 + 0xa8;
      uVar12 = iVar11 + 0x20;
    }
    local_118 = (ulong)((int)local_118 + 0xc);
    local_110 = local_f0 + lVar14;
  }
  playButton = (WINDOW *)newwin(3,5,local_118 & 0xffffffff,startX + 1);
  wbkgd(playButton,0x200);
  mvwprintw(playButton,1,0,"PLAY");
  wrefresh(playButton);
  stopButton = (WINDOW *)newwin(3,5,uVar8 & 0xffffffff,iVar11 + 7);
  wbkgd(stopButton,0x300);
  mvwprintw(stopButton,1,0,"STOP");
  wrefresh(stopButton);
  pauseButton = (WINDOW *)newwin(3,5,uVar8 & 0xffffffff,iVar11 + 0xd);
  wbkgd(pauseButton,0x400);
  mvwprintw(pauseButton,1,0,"PAUSE");
  wrefresh(pauseButton);
  decreaseDelayButton = (WINDOW *)newwin(3,5,uVar8 & 0xffffffff,iVar11 + 0x14);
  wbkgd(decreaseDelayButton,0x100);
  mvwprintw(decreaseDelayButton,1,2,anon_var_dwarf_4ee15);
  wrefresh(decreaseDelayButton);
  increaseDelayButton = (WINDOW *)newwin(3,5,uVar8 & 0xffffffff,iVar11 + 0x1a);
  wbkgd(increaseDelayButton,0x100);
  mvwprintw(increaseDelayButton,1,2,"+");
  wrefresh(increaseDelayButton);
  pWVar3 = (WINDOW *)newwin(1,5,iVar1 + 1,iVar11 + 0x20);
  delayValueWindow = pWVar3;
  intToString_abi_cxx11_((string *)&local_d8,tickDelay);
  mvwprintw(pWVar3,0,0,"%s",local_d8._0_8_);
  std::__cxx11::string::~string((string *)&local_d8);
  wrefresh(delayValueWindow);
  lVar14 = 0x40;
  pnVar6 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pnVar10 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
            _M_start;
  for (uVar8 = 0; uVar8 < (ulong)(((long)pnVar6 - (long)pnVar10) / 0xa8); uVar8 = uVar8 + 1) {
    if (*(long *)((long)pnVar10->arrows + lVar14 + -0x80) == *(long *)(&pnVar10->nodeId + lVar14)) {
      std::__cxx11::string::string((string *)&local_d8,"",&local_119);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (&pnVar10->nodeId + lVar14),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      pnVar6 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      pnVar10 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data
                ._M_start;
    }
    lVar14 = lVar14 + 0xa8;
  }
  refresh();
  return;
}

Assistant:

void initSystem(int begX, int begY) {
	startX = begX;
	startY = begY;
  int c, x, y, id;
  int max_x, max_y;
  int nID=0;
  WINDOW *menu;

  getmaxyx(stdscr, max_y, max_x);

  y = startY;
  for(int i=0;i<grid_size[0]; i++){
    x = startX + GAP_WIDTH_H;
    for(int j=0;j<grid_size[1];j++){
      grid.push_back(node(nID));
      grid[nID].w_main=new_bwin(NODE_HEIGHT, NODE_WIDTH, y, x);
      grid[nID].w_reg =newwin(NODE_HEIGHT-2,NODE_WIDTH-CODE_WIDTH-2, y+1, x+CODE_WIDTH+1);
      grid[nID].w_code=newwin(NODE_HEIGHT - 2, CODE_WIDTH - 2, y + 1 , x + 1);
      grid[nID].w_divider=new_bwin(NODE_HEIGHT, CODE_WIDTH, y, x);

      wprintw(grid[nID].w_reg, " ACC%d\n BAK%d", grid[nID].acc, grid[nID].bak);
      wrefresh(grid[nID].w_reg);
      refresh();

      if (i != 0) {
      	grid[nID].arrows[0] = grid[nID - grid_size[1]].arrows[2];
      }

      if (j != grid_size[1] - 1) {
      	grid[nID].arrows[1] = new arrow(nID, nID + 1, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x + NODE_WIDTH + GAP_WIDTH_H, false);
      	gridArrows.push_back(grid[nID].arrows[1]);
      }

      if (i != grid_size[0] - 1) {
      	grid[nID].arrows[2] = new arrow(nID, nID + grid_size[0], y + NODE_HEIGHT + GAP_WIDTH_V, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), true);
	gridArrows.push_back(grid[nID].arrows[2]);
      }

      if (j != 0) {
      	grid[nID].arrows[3] = grid[nID - 1].arrows[1];
      }
      nID++;
      x = x + NODE_WIDTH + ARROW_H_WIDTH + 2 * GAP_WIDTH_H;
    }
    y=y+(NODE_HEIGHT+2*GAP_WIDTH_V+ARROW_V_HEIGHT);
  }

  x = startX + GAP_WIDTH_H;
  playButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(playButton, COLOR_PAIR(2));
  mvwprintw(playButton, BUTTON_HEIGHT/2,0,"PLAY");
  wrefresh(playButton);
  x += BUTTON_WIDTH + GAP_WIDTH_H;

  stopButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(stopButton, COLOR_PAIR(3));
  mvwprintw(stopButton, BUTTON_HEIGHT/2,0,"STOP");
  wrefresh(stopButton);

  x += BUTTON_WIDTH + GAP_WIDTH_H;
  pauseButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(pauseButton, COLOR_PAIR(4));
  mvwprintw(pauseButton, BUTTON_HEIGHT/2,0,"PAUSE");
  wrefresh(pauseButton);


  x += BUTTON_WIDTH + GAP_WIDTH_H * 2;
	decreaseDelayButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
	wbkgd(decreaseDelayButton, COLOR_PAIR(1));
	mvwprintw(decreaseDelayButton, 1, 2, "–");
	wrefresh(decreaseDelayButton);
	
  x += BUTTON_WIDTH + GAP_WIDTH_H;
  increaseDelayButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(increaseDelayButton, COLOR_PAIR(1));
	mvwprintw(increaseDelayButton, 1, 2, "+");
  wrefresh(increaseDelayButton);

  x += BUTTON_WIDTH + GAP_WIDTH_H;
  delayValueWindow = newwin(1, 5, y + 1, x);
  mvwprintw(delayValueWindow, 0, 0, "%s", intToString(tickDelay).c_str());
  wrefresh(delayValueWindow);
  
  for(int i=0; i < grid.size(); i++){
		if(grid[i].inputCode.size() == 0)
			grid[i].inputCode.push_back("");
  }

  refresh();

  return;
}